

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

void P_SerializeWorld(FArchive *arc)

{
  long lVar1;
  DWORD DVar2;
  FArchive *pFVar3;
  FDynamicColormap *pFVar4;
  int iVar5;
  line_t *plVar6;
  ulong uVar7;
  long lVar8;
  sector_t *p;
  zone_t *env;
  BYTE desaturate;
  BYTE sat;
  PalEntry fade;
  PalEntry color;
  byte local_3a;
  BYTE local_39;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_38;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_34;
  
  if (0 < numsectors) {
    iVar5 = 0;
    p = sectors;
    do {
      pFVar3 = operator<<(arc,&p->floorplane);
      operator<<(pFVar3,&p->ceilingplane);
      FArchive::operator<<(arc,(WORD *)&p->lightlevel);
      FArchive::operator<<(arc,(WORD *)&p->special);
      pFVar3 = FArchive::operator<<(arc,&p->soundtraversed);
      pFVar3 = FArchive::operator<<(pFVar3,(WORD *)&p->seqType);
      pFVar3 = FArchive::operator<<(pFVar3,&p->friction);
      pFVar3 = FArchive::operator<<(pFVar3,&p->movefactor);
      pFVar3 = FArchive::operator<<(pFVar3,(BYTE *)&p->stairlock);
      pFVar3 = FArchive::operator<<(pFVar3,(WORD *)&p->prevsec);
      pFVar3 = FArchive::operator<<(pFVar3,(WORD *)&p->nextsec);
      operator<<(pFVar3,p->planes);
      operator<<(pFVar3,p->planes + 1);
      pFVar3 = operator<<(pFVar3,&p->heightsec);
      pFVar3 = FArchive::operator<<(pFVar3,&p->bottommap);
      pFVar3 = FArchive::operator<<(pFVar3,&p->midmap);
      pFVar3 = FArchive::operator<<(pFVar3,&p->topmap);
      FArchive::operator<<(pFVar3,&p->gravity);
      P_SerializeTerrain(arc,p->terrainnum);
      P_SerializeTerrain(arc,p->terrainnum + 1);
      FArchive::operator<<(arc,(DWORD *)&p->damageamount);
      pFVar3 = FArchive::operator<<(arc,(WORD *)&p->damageinterval);
      pFVar3 = FArchive::operator<<(pFVar3,(WORD *)&p->leakydamage);
      pFVar3 = FArchive::operator<<(pFVar3,&(p->damagetype).super_FName);
      pFVar3 = FArchive::operator<<(pFVar3,(DWORD *)&p->sky);
      pFVar3 = FArchive::operator<<(pFVar3,&p->MoreFlags);
      pFVar3 = FArchive::operator<<(pFVar3,&p->Flags);
      pFVar3 = FArchive::operator<<(pFVar3,p->Portals);
      pFVar3 = FArchive::operator<<(pFVar3,p->Portals + 1);
      FArchive::operator<<(pFVar3,&p->ZoneNumber);
      pFVar3 = FArchive::SerializeObject
                         (arc,(DObject **)p->interpolations,DInterpolation::RegistrationInfo.MyClass
                         );
      pFVar3 = FArchive::SerializeObject
                         (pFVar3,(DObject **)(p->interpolations + 1),
                          DInterpolation::RegistrationInfo.MyClass);
      pFVar3 = FArchive::SerializeObject
                         (pFVar3,(DObject **)(p->interpolations + 2),
                          DInterpolation::RegistrationInfo.MyClass);
      pFVar3 = FArchive::SerializeObject
                         (pFVar3,(DObject **)(p->interpolations + 3),
                          DInterpolation::RegistrationInfo.MyClass);
      FArchive::operator<<(pFVar3,&(p->SeqName).super_FName);
      extsector_t::Serialize(p->e,arc);
      if (arc->m_Storing == true) {
        pFVar4 = p->ColorMap;
        pFVar3 = FArchive::operator<<(arc,&(pFVar4->Color).field_0.field_0.a);
        pFVar3 = FArchive::operator<<(pFVar3,&(pFVar4->Color).field_0.field_0.r);
        pFVar3 = FArchive::operator<<(pFVar3,&(pFVar4->Color).field_0.field_0.g);
        pFVar3 = FArchive::operator<<(pFVar3,(BYTE *)&pFVar4->Color);
        pFVar4 = p->ColorMap;
        pFVar3 = FArchive::operator<<(pFVar3,&(pFVar4->Fade).field_0.field_0.a);
        pFVar3 = FArchive::operator<<(pFVar3,&(pFVar4->Fade).field_0.field_0.r);
        pFVar3 = FArchive::operator<<(pFVar3,&(pFVar4->Fade).field_0.field_0.g);
        FArchive::operator<<(pFVar3,(BYTE *)&pFVar4->Fade);
        local_39 = (BYTE)p->ColorMap->Desaturate;
        FArchive::operator<<(arc,&local_39);
      }
      else {
        pFVar3 = FArchive::operator<<(arc,&local_34.field_0.a);
        pFVar3 = FArchive::operator<<(pFVar3,&local_34.field_0.r);
        pFVar3 = FArchive::operator<<(pFVar3,&local_34.field_0.g);
        pFVar3 = FArchive::operator<<(pFVar3,(BYTE *)&local_34.d);
        pFVar3 = FArchive::operator<<(pFVar3,&local_38.field_0.a);
        pFVar3 = FArchive::operator<<(pFVar3,&local_38.field_0.r);
        pFVar3 = FArchive::operator<<(pFVar3,&local_38.field_0.g);
        pFVar3 = FArchive::operator<<(pFVar3,(BYTE *)&local_38.d);
        FArchive::operator<<(pFVar3,&local_3a);
        pFVar4 = GetSpecialLights((PalEntry)local_34.field_0,(PalEntry)local_38.field_0,
                                  (uint)local_3a);
        p->ColorMap = pFVar4;
      }
      pFVar3 = FArchive::operator<<(arc,p->reflect + 1);
      FArchive::operator<<(pFVar3,p->reflect);
      iVar5 = iVar5 + 1;
      p = p + 1;
    } while (iVar5 < numsectors);
  }
  if (0 < numlines) {
    iVar5 = 0;
    plVar6 = lines;
    do {
      pFVar3 = FArchive::operator<<(arc,&plVar6->flags);
      pFVar3 = FArchive::operator<<(pFVar3,&plVar6->activation);
      pFVar3 = FArchive::operator<<(pFVar3,(DWORD *)&plVar6->special);
      FArchive::operator<<(pFVar3,&plVar6->alpha);
      if ((plVar6->special - 0x50U < 6) || (plVar6->special == 0xe2)) {
        P_SerializeACSScriptNumber(arc,plVar6->args,false);
      }
      else {
        FArchive::operator<<(arc,(DWORD *)plVar6->args);
      }
      pFVar3 = FArchive::operator<<(arc,(DWORD *)(plVar6->args + 1));
      pFVar3 = FArchive::operator<<(pFVar3,(DWORD *)(plVar6->args + 2));
      pFVar3 = FArchive::operator<<(pFVar3,(DWORD *)(plVar6->args + 3));
      FArchive::operator<<(pFVar3,(DWORD *)(plVar6->args + 4));
      FArchive::operator<<(arc,&plVar6->portalindex);
      FArchive::operator<<(arc,&plVar6->portaltransferred);
      lVar8 = 9;
      do {
        lVar1 = *(long *)(plVar6->args + lVar8 * 2 + -0xb);
        if (lVar1 != 0) {
          operator<<(arc,(part *)(lVar1 + 0x10));
          operator<<(arc,(part *)(lVar1 + 0x40));
          operator<<(arc,(part *)(lVar1 + 0x70));
          pFVar3 = FArchive::operator<<(arc,(WORD *)(lVar1 + 0xb2));
          pFVar3 = FArchive::operator<<(pFVar3,(BYTE *)(lVar1 + 0xb4));
          pFVar3 = FArchive::operator<<(pFVar3,(DWORD *)(lVar1 + 0xa8));
          pFVar3 = FArchive::operator<<(pFVar3,(DWORD *)(lVar1 + 0xac));
          FArchive::operator<<(pFVar3,(DWORD *)(lVar1 + 0xb8));
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 == 10);
      iVar5 = iVar5 + 1;
      plVar6 = plVar6 + 1;
    } while (iVar5 < numlines);
  }
  FArchive::operator<<(arc,(DWORD *)&numzones);
  if (arc->m_Loading == true) {
    if (zones != (zone_t *)0x0) {
      operator_delete__(zones);
    }
    uVar7 = 0xffffffffffffffff;
    if (-1 < (long)numzones) {
      uVar7 = (long)numzones * 8;
    }
    zones = (zone_t *)operator_new__(uVar7);
  }
  if (0 < numzones) {
    iVar5 = 0;
    env = zones;
    do {
      operator<<(arc,&env->Environment);
      iVar5 = iVar5 + 1;
      env = env + 1;
    } while (iVar5 < numzones);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,linePortals.Count);
  }
  else {
    DVar2 = FArchive::ReadCount(arc);
    TArray<FLinePortal,_FLinePortal>::Resize(&linePortals,DVar2);
  }
  if (linePortals.Count != 0) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      operator<<(arc,(FLinePortal *)((long)&(linePortals.Array)->mOrigin + lVar8));
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x48;
    } while (uVar7 < linePortals.Count);
  }
  if (arc->m_Storing == true) {
    FArchive::WriteCount(arc,sectorPortals.Count);
  }
  else {
    DVar2 = FArchive::ReadCount(arc);
    TArray<FSectorPortal,_FSectorPortal>::Resize(&sectorPortals,DVar2);
  }
  if (sectorPortals.Count != 0) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      operator<<(arc,(FSectorPortal *)((long)&(sectorPortals.Array)->mType + lVar8));
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x40;
    } while (uVar7 < sectorPortals.Count);
  }
  P_CollectLinkedPortals();
  return;
}

Assistant:

void P_SerializeWorld (FArchive &arc)
{
	int i, j;
	sector_t *sec;
	line_t *li;
	zone_t *zn;

	// do sectors
	for (i = 0, sec = sectors; i < numsectors; i++, sec++)
	{
		arc << sec->floorplane
			<< sec->ceilingplane;
		arc << sec->lightlevel;
		arc << sec->special;
		arc << sec->soundtraversed
			<< sec->seqType
			<< sec->friction
			<< sec->movefactor
			<< sec->stairlock
			<< sec->prevsec
			<< sec->nextsec
			<< sec->planes[sector_t::floor]
			<< sec->planes[sector_t::ceiling]
			<< sec->heightsec
			<< sec->bottommap << sec->midmap << sec->topmap
			<< sec->gravity;
		P_SerializeTerrain(arc, sec->terrainnum[0]);
		P_SerializeTerrain(arc, sec->terrainnum[1]);
		arc << sec->damageamount;
		arc << sec->damageinterval
			<< sec->leakydamage
			<< sec->damagetype
			<< sec->sky
			<< sec->MoreFlags
			<< sec->Flags
			<< sec->Portals[sector_t::floor] << sec->Portals[sector_t::ceiling]
			<< sec->ZoneNumber;
		arc	<< sec->interpolations[0]
			<< sec->interpolations[1]
			<< sec->interpolations[2]
			<< sec->interpolations[3]
			<< sec->SeqName;

		sec->e->Serialize(arc);
		if (arc.IsStoring ())
		{
			arc << sec->ColorMap->Color
				<< sec->ColorMap->Fade;
			BYTE sat = sec->ColorMap->Desaturate;
			arc << sat;
		}
		else
		{
			PalEntry color, fade;
			BYTE desaturate;
			arc << color << fade
				<< desaturate;
			sec->ColorMap = GetSpecialLights (color, fade, desaturate);
		}
		// begin of GZDoom additions
		arc << sec->reflect[sector_t::ceiling] << sec->reflect[sector_t::floor];
		// end of GZDoom additions
	}

	// do lines
	for (i = 0, li = lines; i < numlines; i++, li++)
	{
		arc << li->flags
			<< li->activation
			<< li->special
			<< li->alpha;

		if (P_IsACSSpecial(li->special))
		{
			P_SerializeACSScriptNumber(arc, li->args[0], false);
		}
		else
		{
			arc << li->args[0];
		}
		arc << li->args[1] << li->args[2] << li->args[3] << li->args[4];

			arc << li->portalindex;
			arc << li->portaltransferred;	// GZDoom addition.

		for (j = 0; j < 2; j++)
		{
			if (li->sidedef[j] == NULL)
				continue;

			side_t *si = li->sidedef[j];
			arc << si->textures[side_t::top]
				<< si->textures[side_t::mid]
				<< si->textures[side_t::bottom]
				<< si->Light
				<< si->Flags
				<< si->LeftSide
				<< si->RightSide
				<< si->Index;
		}
	}

	// do zones
	arc << numzones;

	if (arc.IsLoading())
	{
		if (zones != NULL)
		{
			delete[] zones;
		}
		zones = new zone_t[numzones];
	}

	for (i = 0, zn = zones; i < numzones; ++i, ++zn)
	{
		arc << zn->Environment;
	}

	arc << linePortals << sectorPortals;
	P_CollectLinkedPortals();
}